

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

block * __thiscall storage::get(block *__return_storage_ptr__,storage *this,bool *ok,uint64_t idx)

{
  bool bVar1;
  undefined1 local_a0 [8];
  block b;
  
  __return_storage_ptr__->idx = 0;
  __return_storage_ptr__->timestamp = 0;
  (__return_storage_ptr__->prevsha256)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->prevsha256).field_2;
  (__return_storage_ptr__->prevsha256)._M_string_length = 0;
  (__return_storage_ptr__->prevsha256).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->data).field_2
  ;
  (__return_storage_ptr__->data)._M_string_length = 0;
  (__return_storage_ptr__->data).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->sha256)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->sha256).field_2;
  (__return_storage_ptr__->sha256)._M_string_length = 0;
  (__return_storage_ptr__->sha256).field_2._M_local_buf[0] = '\0';
  bVar1 = empty(this);
  if (bVar1) {
LAB_00104da9:
    bVar1 = false;
  }
  else {
    first((block *)local_a0,this);
    while( true ) {
      block::operator=(__return_storage_ptr__,(block *)local_a0);
      block::~block((block *)local_a0);
      if (__return_storage_ptr__->idx == idx) break;
      bVar1 = at_end(this);
      if (bVar1) goto LAB_00104da9;
      read_block((block *)local_a0,this);
    }
    bVar1 = true;
  }
  *ok = bVar1;
  return __return_storage_ptr__;
}

Assistant:

block get(bool *ok, std::uint64_t idx) {
        block b{};
        if ( empty() ) {
            *ok = false;
            return b;
        }

        for ( b = first(); ; b = next() ) {
            if ( b.idx == idx ) {
                *ok = true;
                return b;
            }

            if ( at_end() ) {
                break;
            }
        }

        *ok = false;

        return b;
    }